

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::IslamicCalendar::handleGetYearLength(IslamicCalendar *this,int32_t extendedYear)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  int len;
  uint uVar4;
  int i;
  uint uVar5;
  
  switch(*(undefined4 *)&(this->super_Calendar).field_0x264) {
  case 0:
    iVar1 = trueMonthStart(this,extendedYear * 0xc);
    iVar2 = trueMonthStart(this,extendedYear * 0xc + -0xc);
    return iVar1 - iVar2;
  case 2:
    if (0xfffffed2 < extendedYear - 0x641U) goto switchD_001ff5ff_default;
  case 1:
  case 3:
    uVar4 = (extendedYear * 0xb + 0xe) % 0x1e < 0xb | 0x162;
    break;
  default:
switchD_001ff5ff_default:
    uVar4 = 0;
    for (uVar5 = 0; uVar5 != 0xc; uVar5 = uVar5 + 1) {
      iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])
                        (this,(ulong)(uint)extendedYear,(ulong)uVar5);
      uVar4 = uVar4 + iVar3;
    }
  }
  return uVar4;
}

Assistant:

int32_t IslamicCalendar::handleGetYearLength(int32_t extendedYear) const {
    if (cType == CIVIL || cType == TBLA ||
        (cType == UMALQURA && (extendedYear<UMALQURA_YEAR_START || extendedYear>UMALQURA_YEAR_END)) ) {
        return 354 + (civilLeapYear(extendedYear) ? 1 : 0);
    } else if(cType == ASTRONOMICAL){
        int32_t month = 12*(extendedYear-1);
        return (trueMonthStart(month + 12) - trueMonthStart(month));
    } else {
        int len = 0;
        for(int i=0; i<12; i++) {
            len += handleGetMonthLength(extendedYear, i);
        }
        return len;
    }
}